

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_257,_false,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  byte bVar11;
  undefined1 auVar12 [12];
  byte bVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float fVar45;
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined4 uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  vfloat4 a0;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_23b8 [4];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar39 [32];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar56 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar12 = ZEXT812(0) << 0x20;
    auVar25 = ZEXT816(0) << 0x40;
    auVar52._4_12_ = auVar12;
    auVar52._0_4_ = auVar56._0_4_;
    auVar23 = vrsqrt14ss_avx512f(auVar25,auVar52);
    fVar51 = auVar23._0_4_;
    local_23b8[0] = fVar51 * 1.5 - auVar56._0_4_ * 0.5 * fVar51 * fVar51 * fVar51;
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar51 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar62._0_4_ = aVar7.x * local_23b8[0];
    auVar62._4_4_ = aVar7.y * local_23b8[0];
    auVar62._8_4_ = aVar7.z * local_23b8[0];
    auVar62._12_4_ = aVar7.field_3.w * local_23b8[0];
    auVar23 = vshufpd_avx(auVar62,auVar62,1);
    auVar56 = vmovshdup_avx(auVar62);
    auVar47._8_4_ = 0x80000000;
    auVar47._0_8_ = 0x8000000080000000;
    auVar47._12_4_ = 0x80000000;
    auVar34._16_4_ = 0x80000000;
    auVar34._0_16_ = auVar47;
    auVar34._20_4_ = 0x80000000;
    auVar34._24_4_ = 0x80000000;
    auVar34._28_4_ = 0x80000000;
    auVar65._0_4_ = auVar56._0_4_ ^ 0x80000000;
    auVar56 = vunpckhps_avx(auVar62,auVar25);
    auVar65._4_12_ = auVar12;
    auVar26 = vshufps_avx(auVar56,auVar65,0x41);
    auVar63._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
    auVar63._8_8_ = auVar23._8_8_ ^ auVar47._8_8_;
    auVar24 = vinsertps_avx(auVar63,auVar62,0x2a);
    auVar56 = vdpps_avx(auVar26,auVar26,0x7f);
    auVar23 = vdpps_avx(auVar24,auVar24,0x7f);
    uVar10 = vcmpps_avx512vl(auVar23,auVar56,1);
    auVar56 = vpmovm2d_avx512vl(uVar10);
    auVar66._0_4_ = auVar56._0_4_;
    auVar66._4_4_ = auVar66._0_4_;
    auVar66._8_4_ = auVar66._0_4_;
    auVar66._12_4_ = auVar66._0_4_;
    uVar21 = vpmovd2m_avx512vl(auVar66);
    auVar56 = vpcmpeqd_avx(auVar66,auVar66);
    auVar23._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar56._4_4_;
    auVar23._0_4_ = (uint)((byte)uVar21 & 1) * auVar56._0_4_;
    auVar23._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar56._8_4_;
    auVar23._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar56._12_4_;
    auVar56 = vblendvps_avx(auVar24,auVar26,auVar23);
    auVar23 = vdpps_avx(auVar56,auVar56,0x7f);
    auVar67._4_12_ = auVar12;
    auVar67._0_4_ = auVar23._0_4_;
    auVar24 = vrsqrt14ss_avx512f(auVar25,auVar67);
    fVar45 = auVar24._0_4_;
    fVar45 = fVar45 * 1.5 - auVar23._0_4_ * 0.5 * fVar45 * fVar45 * fVar45;
    auVar64._0_4_ = auVar56._0_4_ * fVar45;
    auVar64._4_4_ = auVar56._4_4_ * fVar45;
    auVar64._8_4_ = auVar56._8_4_ * fVar45;
    auVar64._12_4_ = auVar56._12_4_ * fVar45;
    auVar56 = vshufps_avx(auVar64,auVar64,0xc9);
    auVar23 = vshufps_avx(auVar62,auVar62,0xc9);
    auVar68._0_4_ = auVar64._0_4_ * auVar23._0_4_;
    auVar68._4_4_ = auVar64._4_4_ * auVar23._4_4_;
    auVar68._8_4_ = auVar64._8_4_ * auVar23._8_4_;
    auVar68._12_4_ = auVar64._12_4_ * auVar23._12_4_;
    auVar56 = vfmsub231ps_fma(auVar68,auVar62,auVar56);
    auVar23 = vshufps_avx(auVar56,auVar56,0xc9);
    auVar56 = vdpps_avx(auVar23,auVar23,0x7f);
    auVar53._4_12_ = auVar12;
    auVar53._0_4_ = auVar56._0_4_;
    auVar24 = vrsqrt14ss_avx512f(auVar25,auVar53);
    fVar45 = auVar24._0_4_;
    fVar45 = fVar45 * 1.5 - auVar56._0_4_ * 0.5 * fVar45 * fVar45 * fVar45;
    auVar54._0_4_ = auVar23._0_4_ * fVar45;
    auVar54._4_4_ = auVar23._4_4_ * fVar45;
    auVar54._8_4_ = auVar23._8_4_ * fVar45;
    auVar54._12_4_ = auVar23._12_4_ * fVar45;
    auVar56._0_4_ = local_23b8[0] * auVar62._0_4_;
    auVar56._4_4_ = local_23b8[0] * auVar62._4_4_;
    auVar56._8_4_ = local_23b8[0] * auVar62._8_4_;
    auVar56._12_4_ = local_23b8[0] * auVar62._12_4_;
    auVar24 = vunpcklps_avx(auVar64,auVar56);
    auVar56 = vunpckhps_avx(auVar64,auVar56);
    auVar26 = vunpcklps_avx(auVar54,auVar25);
    auVar23 = vunpckhps_avx(auVar54,auVar25);
    local_23a8 = vunpcklps_avx(auVar24,auVar26);
    local_2398 = vunpckhps_avx(auVar24,auVar26);
    local_2388 = vunpcklps_avx(auVar56,auVar23);
    puVar18 = local_2368;
    auVar50 = ZEXT864(0) << 0x20;
    auVar56 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar23 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx512vl((undefined1  [16])aVar7,auVar24);
    local_2370[0] = 0;
    auVar60._8_4_ = 0x219392ef;
    auVar60._0_8_ = 0x219392ef219392ef;
    auVar60._12_4_ = 0x219392ef;
    uVar21 = vcmpps_avx512vl(auVar24,auVar60,1);
    bVar8 = (bool)((byte)uVar21 & 1);
    auVar25._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.x;
    bVar8 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.y;
    bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.z;
    bVar8 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar7.field_3.a;
    auVar24 = vrcp14ps_avx512vl(auVar25);
    auVar26._8_4_ = 0x3f800000;
    auVar26._0_8_ = 0x3f8000003f800000;
    auVar26._12_4_ = 0x3f800000;
    auVar26 = vfnmadd213ps_avx512vl(auVar25,auVar24,auVar26);
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar25 = vfmadd132ps_fma(auVar26,auVar24,auVar24);
    uVar6 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar27 = vbroadcastss_avx512vl(auVar25);
    auVar24 = vmovshdup_avx(auVar25);
    auVar28 = vbroadcastsd_avx512vl(auVar24);
    auVar26 = vshufpd_avx(auVar25,auVar25,1);
    auVar30._8_4_ = 2;
    auVar30._0_8_ = 0x200000002;
    auVar30._12_4_ = 2;
    auVar30._16_4_ = 2;
    auVar30._20_4_ = 2;
    auVar30._24_4_ = 2;
    auVar30._28_4_ = 2;
    auVar29 = vpermps_avx512vl(auVar30,ZEXT1632(auVar25));
    fVar45 = auVar25._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar31._4_4_ = fVar45;
    auVar31._0_4_ = fVar45;
    auVar31._8_4_ = fVar45;
    auVar31._12_4_ = fVar45;
    auVar31._16_4_ = fVar45;
    auVar31._20_4_ = fVar45;
    auVar31._24_4_ = fVar45;
    auVar31._28_4_ = fVar45;
    auVar32._8_4_ = 1;
    auVar32._0_8_ = 0x100000001;
    auVar32._12_4_ = 1;
    auVar32._16_4_ = 1;
    auVar32._20_4_ = 1;
    auVar32._24_4_ = 1;
    auVar32._28_4_ = 1;
    auVar33 = ZEXT1632(CONCAT412(auVar25._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar25._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar25._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar45))
                                ));
    auVar32 = vpermps_avx2(auVar32,auVar33);
    auVar33 = vpermps_avx2(auVar30,auVar33);
    uVar20 = (ulong)(auVar25._0_4_ < 0.0) * 0x20;
    uVar19 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
    uVar21 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x80;
    auVar30 = vbroadcastss_avx512vl(auVar56);
    uVar55 = auVar23._0_4_;
    auVar46 = ZEXT3264(CONCAT428(uVar55,CONCAT424(uVar55,CONCAT420(uVar55,CONCAT416(uVar55,CONCAT412
                                                  (uVar55,CONCAT48(uVar55,CONCAT44(uVar55,uVar55))))
                                                  ))));
    auVar31 = vxorps_avx512vl(auVar31,auVar34);
    auVar32 = vxorps_avx512vl(auVar32,auVar34);
    auVar33 = vxorps_avx512vl(auVar33,auVar34);
    auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar72 = ZEXT3264(auVar34);
    auVar34 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar73 = ZEXT3264(auVar34);
    do {
      pfVar1 = (float *)(puVar18 + -1);
      auVar48 = ZEXT464((uint)*pfVar1);
      puVar18 = puVar18 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar17 = *puVar18;
LAB_01f1474d:
        if ((uVar17 & 0xf) == 0) {
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar20),auVar31,auVar27);
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar19),auVar32,auVar28);
          auVar34 = vpmaxsd_avx2(auVar34,auVar35);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar21),auVar33,auVar29);
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar20 ^ 0x20)),auVar31,
                               auVar27);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar19 ^ 0x20)),auVar32,
                               auVar28);
          auVar35 = vpminsd_avx2(auVar35,auVar37);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar21 ^ 0x20)),auVar33,
                               auVar29);
          auVar36 = vpmaxsd_avx512vl(auVar36,auVar30);
          auVar34 = vpmaxsd_avx2(auVar34,auVar36);
          auVar36 = vpminsd_avx2(auVar37,auVar46._0_32_);
          auVar35 = vpminsd_avx2(auVar35,auVar36);
          uVar22 = vpcmpd_avx512vl(auVar34,auVar35,2);
        }
        else {
          if ((int)(uVar17 & 0xf) != 2) {
            auVar50 = ZEXT1664(auVar50._0_16_);
            (**(code **)((long)This->leafIntersector +
                        (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40))
                      (local_23b8,ray,context);
            auVar34 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar73 = ZEXT3264(auVar34);
            auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar72 = ZEXT3264(auVar34);
            fVar45 = (ray->super_RayK<1>).tfar;
            auVar46 = ZEXT3264(CONCAT428(fVar45,CONCAT424(fVar45,CONCAT420(fVar45,CONCAT416(fVar45,
                                                  CONCAT412(fVar45,CONCAT48(fVar45,CONCAT44(fVar45,
                                                  fVar45))))))));
            goto LAB_01f14d0d;
          }
          uVar14 = uVar17 & 0xfffffffffffffff0;
          auVar34 = *(undefined1 (*) [32])(uVar14 + 0x100);
          auVar49._0_4_ = fVar51 * auVar34._0_4_;
          auVar49._4_4_ = fVar51 * auVar34._4_4_;
          auVar49._8_4_ = fVar51 * auVar34._8_4_;
          auVar49._12_4_ = fVar51 * auVar34._12_4_;
          auVar49._16_4_ = fVar51 * auVar34._16_4_;
          auVar49._20_4_ = fVar51 * auVar34._20_4_;
          auVar49._28_36_ = auVar48._28_36_;
          auVar49._24_4_ = fVar51 * auVar34._24_4_;
          auVar35 = *(undefined1 (*) [32])(uVar14 + 0x120);
          auVar36 = *(undefined1 (*) [32])(uVar14 + 0x140);
          auVar48._0_4_ = fVar51 * auVar35._0_4_;
          auVar48._4_4_ = fVar51 * auVar35._4_4_;
          auVar48._8_4_ = fVar51 * auVar35._8_4_;
          auVar48._12_4_ = fVar51 * auVar35._12_4_;
          auVar48._16_4_ = fVar51 * auVar35._16_4_;
          auVar48._20_4_ = fVar51 * auVar35._20_4_;
          auVar48._28_36_ = auVar50._28_36_;
          auVar48._24_4_ = fVar51 * auVar35._24_4_;
          auVar37._4_4_ = fVar51 * auVar36._4_4_;
          auVar37._0_4_ = fVar51 * auVar36._0_4_;
          auVar37._8_4_ = fVar51 * auVar36._8_4_;
          auVar37._12_4_ = fVar51 * auVar36._12_4_;
          auVar37._16_4_ = fVar51 * auVar36._16_4_;
          auVar37._20_4_ = fVar51 * auVar36._20_4_;
          auVar37._24_4_ = fVar51 * auVar36._24_4_;
          auVar37._28_4_ = fVar51;
          auVar43._4_4_ = uVar3;
          auVar43._0_4_ = uVar3;
          auVar43._8_4_ = uVar3;
          auVar43._12_4_ = uVar3;
          auVar43._16_4_ = uVar3;
          auVar43._20_4_ = uVar3;
          auVar43._24_4_ = uVar3;
          auVar43._28_4_ = uVar3;
          auVar56 = vfmadd231ps_fma(auVar49._0_32_,auVar43,*(undefined1 (*) [32])(uVar14 + 0xa0));
          auVar23 = vfmadd231ps_fma(auVar48._0_32_,auVar43,*(undefined1 (*) [32])(uVar14 + 0xc0));
          auVar24 = vfmadd231ps_fma(auVar37,auVar43,*(undefined1 (*) [32])(uVar14 + 0xe0));
          auVar9._4_4_ = uVar2;
          auVar9._0_4_ = uVar2;
          auVar9._8_4_ = uVar2;
          auVar9._12_4_ = uVar2;
          auVar9._16_4_ = uVar2;
          auVar9._20_4_ = uVar2;
          auVar9._24_4_ = uVar2;
          auVar9._28_4_ = uVar2;
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar9,*(undefined1 (*) [32])(uVar14 + 0x40));
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar9,*(undefined1 (*) [32])(uVar14 + 0x60));
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar9,*(undefined1 (*) [32])(uVar14 + 0x80));
          auVar69._8_4_ = 0x7fffffff;
          auVar69._0_8_ = 0x7fffffff7fffffff;
          auVar69._12_4_ = 0x7fffffff;
          auVar69._16_4_ = 0x7fffffff;
          auVar69._20_4_ = 0x7fffffff;
          auVar69._24_4_ = 0x7fffffff;
          auVar69._28_4_ = 0x7fffffff;
          auVar37 = vandps_avx(auVar69,ZEXT1632(auVar56));
          auVar71._8_4_ = 0x219392ef;
          auVar71._0_8_ = 0x219392ef219392ef;
          auVar71._12_4_ = 0x219392ef;
          auVar71._16_4_ = 0x219392ef;
          auVar71._20_4_ = 0x219392ef;
          auVar71._24_4_ = 0x219392ef;
          auVar71._28_4_ = 0x219392ef;
          uVar22 = vcmpps_avx512vl(auVar37,auVar71,1);
          bVar8 = (bool)((byte)uVar22 & 1);
          auVar42._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar56._0_4_;
          bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
          auVar42._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar56._4_4_;
          bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
          auVar42._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar56._8_4_;
          bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
          auVar42._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar56._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * 0x219392ef;
          auVar42._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * 0x219392ef;
          auVar42._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * 0x219392ef;
          auVar42._28_4_ = (uint)(byte)(uVar22 >> 7) * 0x219392ef;
          auVar37 = vandps_avx(auVar69,ZEXT1632(auVar23));
          uVar22 = vcmpps_avx512vl(auVar37,auVar71,1);
          bVar8 = (bool)((byte)uVar22 & 1);
          auVar41._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._0_4_;
          bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
          auVar41._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._4_4_;
          bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
          auVar41._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._8_4_;
          bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
          auVar41._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar23._12_4_;
          auVar41._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * 0x219392ef;
          auVar41._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * 0x219392ef;
          auVar41._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * 0x219392ef;
          auVar41._28_4_ = (uint)(byte)(uVar22 >> 7) * 0x219392ef;
          auVar37 = vandps_avx(auVar69,ZEXT1632(auVar24));
          uVar22 = vcmpps_avx512vl(auVar37,auVar71,1);
          bVar8 = (bool)((byte)uVar22 & 1);
          auVar40._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._0_4_;
          bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._4_4_;
          bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._8_4_;
          bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * 0x219392ef;
          auVar40._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * 0x219392ef;
          auVar40._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * 0x219392ef;
          auVar40._28_4_ = (uint)(byte)(uVar22 >> 7) * 0x219392ef;
          auVar37 = vrcp14ps_avx512vl(auVar42);
          auVar70._8_4_ = 0x3f800000;
          auVar70._0_8_ = 0x3f8000003f800000;
          auVar70._12_4_ = 0x3f800000;
          auVar70._16_4_ = 0x3f800000;
          auVar70._20_4_ = 0x3f800000;
          auVar70._24_4_ = 0x3f800000;
          auVar70._28_4_ = 0x3f800000;
          auVar56 = vfnmadd213ps_fma(auVar42,auVar37,auVar70);
          auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar37,auVar37);
          auVar37 = vrcp14ps_avx512vl(auVar41);
          auVar23 = vfnmadd213ps_fma(auVar41,auVar37,auVar70);
          auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar37,auVar37);
          auVar37 = vrcp14ps_avx512vl(auVar40);
          auVar24 = vfnmadd213ps_fma(auVar40,auVar37,auVar70);
          auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar37,auVar37);
          auVar38._4_4_ = uVar6;
          auVar38._0_4_ = uVar6;
          auVar38._8_4_ = uVar6;
          auVar38._12_4_ = uVar6;
          auVar38._16_4_ = uVar6;
          auVar38._20_4_ = uVar6;
          auVar38._24_4_ = uVar6;
          auVar38._28_4_ = uVar6;
          auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,*(undefined1 (*) [32])(uVar14 + 0x160));
          auVar37 = vfmadd213ps_avx512vl(auVar35,auVar38,*(undefined1 (*) [32])(uVar14 + 0x180));
          auVar36 = vfmadd213ps_avx512vl(auVar36,auVar38,*(undefined1 (*) [32])(uVar14 + 0x1a0));
          auVar35._4_4_ = uVar5;
          auVar35._0_4_ = uVar5;
          auVar35._8_4_ = uVar5;
          auVar35._12_4_ = uVar5;
          auVar35._16_4_ = uVar5;
          auVar35._20_4_ = uVar5;
          auVar35._24_4_ = uVar5;
          auVar35._28_4_ = uVar5;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar35,*(undefined1 (*) [32])(uVar14 + 0xa0));
          auVar37 = vfmadd231ps_avx512vl(auVar37,auVar35,*(undefined1 (*) [32])(uVar14 + 0xc0));
          auVar35 = vfmadd231ps_avx512vl(auVar36,auVar35,*(undefined1 (*) [32])(uVar14 + 0xe0));
          auVar36._4_4_ = uVar4;
          auVar36._0_4_ = uVar4;
          auVar36._8_4_ = uVar4;
          auVar36._12_4_ = uVar4;
          auVar36._16_4_ = uVar4;
          auVar36._20_4_ = uVar4;
          auVar36._24_4_ = uVar4;
          auVar36._28_4_ = uVar4;
          auVar26 = vfmadd231ps_fma(auVar34,auVar36,*(undefined1 (*) [32])(uVar14 + 0x40));
          auVar61._0_4_ = -auVar56._0_4_ * auVar26._0_4_;
          auVar61._4_4_ = -auVar56._4_4_ * auVar26._4_4_;
          auVar61._8_4_ = -auVar56._8_4_ * auVar26._8_4_;
          auVar61._12_4_ = -auVar56._12_4_ * auVar26._12_4_;
          auVar61._16_4_ = 0x80000000;
          auVar61._20_4_ = 0x80000000;
          auVar61._24_4_ = 0x80000000;
          auVar61._28_4_ = 0;
          auVar26 = vfmadd231ps_fma(auVar37,auVar36,*(undefined1 (*) [32])(uVar14 + 0x60));
          auVar59._0_4_ = -auVar23._0_4_ * auVar26._0_4_;
          auVar59._4_4_ = -auVar23._4_4_ * auVar26._4_4_;
          auVar59._8_4_ = -auVar23._8_4_ * auVar26._8_4_;
          auVar59._12_4_ = -auVar23._12_4_ * auVar26._12_4_;
          auVar59._16_4_ = 0x80000000;
          auVar59._20_4_ = 0x80000000;
          auVar59._24_4_ = 0x80000000;
          auVar59._28_4_ = 0;
          auVar26 = vfmadd231ps_fma(auVar35,auVar36,*(undefined1 (*) [32])(uVar14 + 0x80));
          auVar57._0_4_ = -auVar24._0_4_ * auVar26._0_4_;
          auVar57._4_4_ = -auVar24._4_4_ * auVar26._4_4_;
          auVar57._8_4_ = -auVar24._8_4_ * auVar26._8_4_;
          auVar57._12_4_ = -auVar24._12_4_ * auVar26._12_4_;
          auVar57._16_4_ = 0x80000000;
          auVar57._20_4_ = 0x80000000;
          auVar57._24_4_ = 0x80000000;
          auVar57._28_4_ = 0;
          auVar36 = ZEXT1632(CONCAT412(auVar56._12_4_ + auVar61._12_4_,
                                       CONCAT48(auVar56._8_4_ + auVar61._8_4_,
                                                CONCAT44(auVar56._4_4_ + auVar61._4_4_,
                                                         auVar56._0_4_ + auVar61._0_4_))));
          auVar37 = ZEXT1632(CONCAT412(auVar23._12_4_ + auVar59._12_4_,
                                       CONCAT48(auVar23._8_4_ + auVar59._8_4_,
                                                CONCAT44(auVar23._4_4_ + auVar59._4_4_,
                                                         auVar23._0_4_ + auVar59._0_4_))));
          auVar43 = ZEXT1632(CONCAT412(auVar24._12_4_ + auVar57._12_4_,
                                       CONCAT48(auVar24._8_4_ + auVar57._8_4_,
                                                CONCAT44(auVar24._4_4_ + auVar57._4_4_,
                                                         auVar24._0_4_ + auVar57._0_4_))));
          auVar38 = vpminsd_avx2(auVar61,auVar36);
          auVar34 = vpminsd_avx2(auVar59,auVar37);
          auVar35 = vpminsd_avx2(auVar57,auVar43);
          auVar34 = vmaxps_avx(auVar34,auVar35);
          auVar36 = vpmaxsd_avx2(auVar61,auVar36);
          auVar35 = vpmaxsd_avx2(auVar59,auVar37);
          auVar37 = vpmaxsd_avx2(auVar57,auVar43);
          auVar35 = vminps_avx(auVar35,auVar37);
          auVar37 = vmaxps_avx512vl(auVar30,auVar38);
          auVar34 = vmaxps_avx(auVar37,auVar34);
          auVar36 = vminps_avx(auVar46._0_32_,auVar36);
          auVar35 = vminps_avx(auVar36,auVar35);
          uVar22 = vcmpps_avx512vl(auVar34,auVar35,2);
        }
        auVar50 = ZEXT3264(auVar35);
        auVar48 = ZEXT3264(auVar34);
        bVar13 = (byte)uVar22;
        if (bVar13 == 0) goto LAB_01f14d0d;
        auVar35 = *(undefined1 (*) [32])(uVar17 & 0xfffffffffffffff0);
        auVar50 = ZEXT3264(auVar35);
        auVar36 = ((undefined1 (*) [32])(uVar17 & 0xfffffffffffffff0))[1];
        auVar37 = vmovdqa64_avx512vl(auVar72._0_32_);
        auVar37 = vpternlogd_avx512vl(auVar37,auVar34,auVar73._0_32_,0xf8);
        auVar38 = vpcompressd_avx512vl(auVar37);
        auVar39._0_4_ =
             (uint)(bVar13 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar37._0_4_;
        bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar37._4_4_;
        bVar8 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar37._8_4_;
        bVar8 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar37._12_4_;
        bVar8 = (bool)((byte)(uVar22 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar8 * auVar38._16_4_ | (uint)!bVar8 * auVar37._16_4_;
        bVar8 = (bool)((byte)(uVar22 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar8 * auVar38._20_4_ | (uint)!bVar8 * auVar37._20_4_;
        bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar8 * auVar38._24_4_ | (uint)!bVar8 * auVar37._24_4_;
        bVar8 = SUB81(uVar22 >> 7,0);
        auVar39._28_4_ = (uint)bVar8 * auVar38._28_4_ | (uint)!bVar8 * auVar37._28_4_;
        auVar37 = vpermt2q_avx512vl(auVar35,auVar39,auVar36);
        uVar17 = auVar37._0_8_;
        bVar13 = bVar13 - 1 & bVar13;
        if (bVar13 != 0) {
          auVar37 = vpshufd_avx2(auVar39,0x55);
          vpermt2q_avx512vl(auVar35,auVar37,auVar36);
          auVar38 = vpminsd_avx2(auVar39,auVar37);
          auVar37 = vpmaxsd_avx2(auVar39,auVar37);
          bVar13 = bVar13 - 1 & bVar13;
          if (bVar13 == 0) {
            auVar38 = vpermi2q_avx512vl(auVar38,auVar35,auVar36);
            uVar17 = auVar38._0_8_;
            auVar35 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
            auVar50 = ZEXT3264(auVar35);
            *puVar18 = auVar35._0_8_;
            auVar34 = vpermd_avx2(auVar37,auVar34);
            auVar48 = ZEXT3264(auVar34);
            *(int *)(puVar18 + 1) = auVar34._0_4_;
            puVar18 = puVar18 + 2;
          }
          else {
            auVar9 = vpshufd_avx2(auVar39,0xaa);
            vpermt2q_avx512vl(auVar35,auVar9,auVar36);
            auVar43 = vpminsd_avx2(auVar38,auVar9);
            auVar38 = vpmaxsd_avx2(auVar38,auVar9);
            auVar9 = vpminsd_avx2(auVar37,auVar38);
            auVar37 = vpmaxsd_avx2(auVar37,auVar38);
            bVar13 = bVar13 - 1 & bVar13;
            if (bVar13 == 0) {
              auVar38 = vpermi2q_avx512vl(auVar43,auVar35,auVar36);
              uVar17 = auVar38._0_8_;
              auVar38 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
              *puVar18 = auVar38._0_8_;
              auVar37 = vpermd_avx2(auVar37,auVar34);
              *(int *)(puVar18 + 1) = auVar37._0_4_;
              auVar35 = vpermt2q_avx512vl(auVar35,auVar9,auVar36);
              auVar50 = ZEXT3264(auVar35);
              puVar18[2] = auVar35._0_8_;
              auVar34 = vpermd_avx2(auVar9,auVar34);
              auVar48 = ZEXT3264(auVar34);
              *(int *)(puVar18 + 3) = auVar34._0_4_;
              puVar18 = puVar18 + 4;
            }
            else {
              auVar38 = vpshufd_avx2(auVar39,0xff);
              vpermt2q_avx512vl(auVar35,auVar38,auVar36);
              auVar42 = vpminsd_avx2(auVar43,auVar38);
              auVar38 = vpmaxsd_avx2(auVar43,auVar38);
              auVar43 = vpminsd_avx2(auVar9,auVar38);
              auVar38 = vpmaxsd_avx2(auVar9,auVar38);
              auVar9 = vpminsd_avx2(auVar37,auVar38);
              auVar37 = vpmaxsd_avx2(auVar37,auVar38);
              bVar13 = bVar13 - 1 & bVar13;
              if (bVar13 == 0) {
                auVar38 = vpermi2q_avx512vl(auVar42,auVar35,auVar36);
                uVar17 = auVar38._0_8_;
                auVar38 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                *puVar18 = auVar38._0_8_;
                auVar37 = vpermd_avx2(auVar37,auVar34);
                *(int *)(puVar18 + 1) = auVar37._0_4_;
                auVar37 = vpermt2q_avx512vl(auVar35,auVar9,auVar36);
                puVar18[2] = auVar37._0_8_;
                auVar37 = vpermd_avx2(auVar9,auVar34);
                *(int *)(puVar18 + 3) = auVar37._0_4_;
                auVar35 = vpermt2q_avx512vl(auVar35,auVar43,auVar36);
                auVar50 = ZEXT3264(auVar35);
                puVar18[4] = auVar35._0_8_;
                auVar34 = vpermd_avx2(auVar43,auVar34);
                auVar48 = ZEXT3264(auVar34);
                *(int *)(puVar18 + 5) = auVar34._0_4_;
                puVar18 = puVar18 + 6;
              }
              else {
                auVar41 = valignd_avx512vl(auVar39,auVar39,3);
                auVar38 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar42 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar38,auVar42);
                auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar43 = vpermt2d_avx512vl(auVar42,auVar38,auVar43);
                auVar43 = vpermt2d_avx512vl(auVar43,auVar38,auVar9);
                auVar38 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar37 = vpermt2d_avx512vl(auVar43,auVar38,auVar37);
                auVar50 = ZEXT3264(auVar37);
                bVar16 = bVar13;
                do {
                  auVar38 = auVar50._0_32_;
                  auVar58._8_4_ = 1;
                  auVar58._0_8_ = 0x100000001;
                  auVar58._12_4_ = 1;
                  auVar58._16_4_ = 1;
                  auVar58._20_4_ = 1;
                  auVar58._24_4_ = 1;
                  auVar58._28_4_ = 1;
                  auVar37 = vpermd_avx2(auVar58,auVar41);
                  auVar41 = valignd_avx512vl(auVar41,auVar41,1);
                  vpermt2q_avx512vl(auVar35,auVar41,auVar36);
                  bVar16 = bVar16 - 1 & bVar16;
                  uVar10 = vpcmpd_avx512vl(auVar37,auVar38,5);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                  bVar11 = (byte)uVar10 << 1;
                  auVar38 = valignd_avx512vl(auVar38,auVar38,7);
                  bVar8 = (bool)((byte)uVar10 & 1);
                  auVar44._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar37._4_4_;
                  auVar44._0_4_ = auVar37._0_4_;
                  bVar8 = (bool)(bVar11 >> 2 & 1);
                  auVar44._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar37._8_4_;
                  bVar8 = (bool)(bVar11 >> 3 & 1);
                  auVar44._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar37._12_4_;
                  bVar8 = (bool)(bVar11 >> 4 & 1);
                  auVar44._16_4_ = (uint)bVar8 * auVar38._16_4_ | (uint)!bVar8 * auVar37._16_4_;
                  bVar8 = (bool)(bVar11 >> 5 & 1);
                  auVar44._20_4_ = (uint)bVar8 * auVar38._20_4_ | (uint)!bVar8 * auVar37._20_4_;
                  bVar8 = (bool)(bVar11 >> 6 & 1);
                  auVar44._24_4_ = (uint)bVar8 * auVar38._24_4_ | (uint)!bVar8 * auVar37._24_4_;
                  auVar44._28_4_ =
                       (uint)(bVar11 >> 7) * auVar38._28_4_ |
                       (uint)!(bool)(bVar11 >> 7) * auVar37._28_4_;
                  auVar50 = ZEXT3264(auVar44);
                } while (bVar16 != 0);
                lVar15 = (ulong)(uint)POPCOUNT((uint)bVar13) + 3;
                do {
                  auVar37 = vpermi2q_avx512vl(auVar44,auVar35,auVar36);
                  *puVar18 = auVar37._0_8_;
                  auVar38 = auVar50._0_32_;
                  auVar37 = vpermd_avx2(auVar38,auVar34);
                  *(int *)(puVar18 + 1) = auVar37._0_4_;
                  auVar44 = valignd_avx512vl(auVar38,auVar38,1);
                  puVar18 = puVar18 + 2;
                  auVar50 = ZEXT3264(auVar44);
                  lVar15 = lVar15 + -1;
                } while (lVar15 != 0);
                auVar34 = vpermt2q_avx512vl(auVar35,auVar44,auVar36);
                auVar50 = ZEXT3264(auVar34);
                uVar17 = auVar34._0_8_;
              }
            }
          }
        }
        goto LAB_01f1474d;
      }
LAB_01f14d0d:
    } while (puVar18 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }